

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

string * testing::internal::UnitTestOptions::GetAbsolutePathToOutputFile_abi_cxx11_(void)

{
  char *pcVar1;
  string *in_RDI;
  string *this;
  allocator<char> local_fa;
  allocator<char> local_f9;
  FilePath result;
  FilePath output_name;
  string local_b8;
  string local_98;
  string local_78;
  string local_58;
  string format;
  
  pcVar1 = FLAGS_gtest_output_abi_cxx11_;
  GetOutputFormat_abi_cxx11_();
  if (format._M_string_length == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&output_name,"xml",(allocator<char> *)&result);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&format,&output_name.pathname_);
    std::__cxx11::string::~string((string *)&output_name.pathname_);
  }
  pcVar1 = strchr(pcVar1,0x3a);
  if (pcVar1 == (char *)0x0) {
    UnitTest::GetInstance();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b8,
               ((UnitTest::GetInstance::instance.impl_)->original_working_dir_).pathname_.
               _M_dataplus._M_p,(allocator<char> *)&local_58);
    FilePath::FilePath(&result,&local_b8);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"test_detail",&local_fa);
    FilePath::FilePath((FilePath *)&local_98,&local_78);
    FilePath::MakeFileName(&output_name,&result,(FilePath *)&local_98,0,format._M_dataplus._M_p);
    std::__cxx11::string::string((string *)in_RDI,&output_name.pathname_);
    std::__cxx11::string::~string((string *)&output_name);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&result);
    this = &local_b8;
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&result,pcVar1 + 1,(allocator<char> *)&local_b8);
    FilePath::FilePath(&output_name,&result.pathname_);
    std::__cxx11::string::~string((string *)&result);
    if (*output_name.pathname_._M_dataplus._M_p != '/') {
      UnitTest::GetInstance();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_98,
                 ((UnitTest::GetInstance::instance.impl_)->original_working_dir_).pathname_.
                 _M_dataplus._M_p,&local_fa);
      FilePath::FilePath((FilePath *)&local_b8,&local_98);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,pcVar1 + 1,&local_f9);
      FilePath::FilePath((FilePath *)&local_78,&local_58);
      FilePath::ConcatPaths(&result,(FilePath *)&local_b8,(FilePath *)&local_78);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                (&output_name.pathname_,&result.pathname_);
      std::__cxx11::string::~string((string *)&result);
      std::__cxx11::string::~string((string *)&local_78);
      std::__cxx11::string::~string((string *)&local_58);
      std::__cxx11::string::~string((string *)&local_b8);
      std::__cxx11::string::~string((string *)&local_98);
    }
    if ((output_name.pathname_._M_string_length == 0) ||
       (output_name.pathname_._M_dataplus._M_p[output_name.pathname_._M_string_length - 1] != '/'))
    {
      std::__cxx11::string::string((string *)in_RDI,&output_name.pathname_);
    }
    else {
      GetCurrentExecutableName();
      GetOutputFormat_abi_cxx11_();
      FilePath::GenerateUniqueFileName
                (&result,&output_name,(FilePath *)&local_b8,local_98._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&local_98);
      std::__cxx11::string::~string((string *)&local_b8);
      std::__cxx11::string::string((string *)in_RDI,&result.pathname_);
      std::__cxx11::string::~string((string *)&result);
    }
    this = &output_name.pathname_;
  }
  std::__cxx11::string::~string((string *)this);
  std::__cxx11::string::~string((string *)&format);
  return in_RDI;
}

Assistant:

std::string UnitTestOptions::GetAbsolutePathToOutputFile() {
  const char* const gtest_output_flag = GTEST_FLAG(output).c_str();

  std::string format = GetOutputFormat();
  if (format.empty())
    format = std::string(kDefaultOutputFormat);

  const char* const colon = strchr(gtest_output_flag, ':');
  if (colon == nullptr)
    return internal::FilePath::MakeFileName(
        internal::FilePath(
            UnitTest::GetInstance()->original_working_dir()),
        internal::FilePath(kDefaultOutputFile), 0,
        format.c_str()).string();

  internal::FilePath output_name(colon + 1);
  if (!output_name.IsAbsolutePath())
    output_name = internal::FilePath::ConcatPaths(
        internal::FilePath(UnitTest::GetInstance()->original_working_dir()),
        internal::FilePath(colon + 1));

  if (!output_name.IsDirectory())
    return output_name.string();

  internal::FilePath result(internal::FilePath::GenerateUniqueFileName(
      output_name, internal::GetCurrentExecutableName(),
      GetOutputFormat().c_str()));
  return result.string();
}